

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

char * riscos_path(char *s)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  
  if (riscos_path::riscosname != (char *)0x0) {
    free(riscos_path::riscosname);
  }
  sVar2 = strlen(s);
  pcVar3 = (char *)malloc(sVar2 + 1);
  riscos_path::riscosname = pcVar3;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    while( true ) {
      cVar1 = s[lVar4];
      cVar5 = '.';
      if ((cVar1 != '/') && (cVar5 = cVar1, cVar1 == '\0')) break;
      pcVar3[lVar4] = cVar5;
      lVar4 = lVar4 + 1;
    }
    pcVar3[lVar4] = '\0';
  }
  return pcVar3;
}

Assistant:

char *
riscos_path(register char *s)
{
	static char *riscosname = NULL;
	register char *cptr;

	if (riscosname)
		free(riscosname);

	riscosname = malloc(strlen(s) + 1);
	if (!riscosname)
		return (NULL);
	for (cptr = riscosname; *s; s++, cptr++)
		if (*s == PATHSEP)
			*cptr = '.';
		else
			*cptr = *s;
	*cptr = '\0';
	return (riscosname);
}